

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QFontEngine::FaceId,QFreetypeFace*>::emplace<QFreetypeFace*const&>
          (QHash<QFontEngine::FaceId,QFreetypeFace*> *this,FaceId *key,QFreetypeFace **args)

{
  QFreetypeFace *pQVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  piter pVar3;
  QHash<QFontEngine::FaceId,_QFreetypeFace_*> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QFreetypeFace **)this;
  if (pQVar1 == (QFreetypeFace *)0x0) {
    local_28.d = (Data *)0x0;
  }
  else {
    if (*(uint *)&pQVar1->face < 2) {
      uVar2._0_4_ = pQVar1->xsize;
      uVar2._4_4_ = pQVar1->ysize;
      if (pQVar1->mm_var < (FT_MM_Var *)(uVar2 >> 1)) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          pVar3 = (piter)emplace_helper<QFreetypeFace*const&>(this,key,args);
          return (iterator)pVar3;
        }
      }
      else {
        local_28.d = (Data *)*args;
        pVar3 = (piter)emplace_helper<QFreetypeFace*>(this,key,(QFreetypeFace **)&local_28);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          return (iterator)pVar3;
        }
      }
      goto LAB_0055a056;
    }
    local_28.d = (Data *)pQVar1;
    if (*(int *)&pQVar1->face != -1) {
      LOCK();
      *(int *)&pQVar1->face = *(int *)&pQVar1->face + 1;
      UNLOCK();
    }
  }
  QHash<QFontEngine::FaceId,_QFreetypeFace_*>::detach
            ((QHash<QFontEngine::FaceId,_QFreetypeFace_*> *)this);
  pVar3 = (piter)emplace_helper<QFreetypeFace*const&>(this,key,args);
  QHash<QFontEngine::FaceId,_QFreetypeFace_*>::~QHash(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
LAB_0055a056:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }